

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::string_t,short>
          (BaseAppender *this,Vector *col,string_t input)

{
  bool bVar1;
  InvalidInputException *this_00;
  undefined8 uVar2;
  bool in_R8B;
  string_t input_00;
  string_t input_01;
  short result;
  undefined2 local_4a;
  string local_48;
  
  uVar2 = 0;
  input_01.value.pointer.ptr = (char *)&local_4a;
  input_01.value._0_8_ = input.value._8_8_;
  bVar1 = TryCast::Operation<duckdb::string_t,short>
                    (input.value._0_8_,input_01,(int16_t *)0x0,in_R8B);
  if (bVar1) {
    *(undefined2 *)(col->data + (this->chunk).count * 2) = local_4a;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input_00.value.pointer.ptr = (char *)uVar2;
  input_00.value._0_8_ = input.value._8_8_;
  CastExceptionText<duckdb::string_t,short>(&local_48,(duckdb *)input.value._0_8_,input_00);
  InvalidInputException::InvalidInputException(this_00,&local_48);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}